

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O1

size_t __thiscall
trieste::PassDef::apply_special<false,true,false>(PassDef *this,Node *root,Match *match)

{
  Effect<Node> *pEVar1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  _func_int **pp_Var4;
  Node *node;
  __shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  __shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong uVar8;
  long *plVar9;
  Effect<Node> *pEVar10;
  bool bVar11;
  _func_int *p_Var12;
  char cVar13;
  size_t sVar14;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  _Var15;
  long lVar16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  Effect<Node> *pEVar19;
  ptrdiff_t pVar20;
  iterator it;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  iterator start;
  Node root_1;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  iterator iStack_90;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  *local_88;
  size_t local_78;
  PassDef *local_70;
  long local_68;
  _Base_ptr local_60;
  NodeIt local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  __shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *local_40;
  long local_38;
  
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
             (root->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pp_Var4 = local_50[1]._vptr__Sp_counted_base;
  p_Var12 = pp_Var4[1];
  if (((ulong)p_Var12 & 0x40) == 0) {
    p_Var2 = &(this->pre_)._M_t._M_impl.super__Rb_tree_header;
    p_Var17 = (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var18 = &p_Var2->_M_header;
    for (; p_Var17 != (_Base_ptr)0x0;
        p_Var17 = (&p_Var17->_M_left)[*(_func_int ***)(p_Var17 + 1) < pp_Var4]) {
      if (*(_func_int ***)(p_Var17 + 1) >= pp_Var4) {
        p_Var18 = p_Var17;
      }
    }
    p_Var17 = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var18 != p_Var2) &&
       (p_Var17 = p_Var18, pp_Var4 < *(_func_int ***)(p_Var18 + 1))) {
      p_Var17 = &p_Var2->_M_header;
    }
    if ((_Rb_tree_header *)p_Var17 != p_Var2) {
      local_98 = local_50;
      iStack_90._M_current =
           (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
            *)local_48;
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_48->_M_use_count = local_48->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_48->_M_use_count = local_48->_M_use_count + 1;
        }
      }
      if (p_Var17[1]._M_right == (_Base_ptr)0x0) {
        std::__throw_bad_function_call();
      }
      sVar14 = (**(code **)(p_Var17 + 2))(&p_Var17[1]._M_parent,&local_98);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iStack_90._M_current !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iStack_90._M_current);
      }
      goto LAB_00177aec;
    }
  }
  sVar14 = 0;
LAB_00177aec:
  if (((ulong)p_Var12 & 0x40) == 0) {
    local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iStack_90._M_current =
         (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
          *)0x0;
    local_88 = (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)0x0;
    local_a8.second._M_current = *(shared_ptr<trieste::NodeDef> **)&local_50[5]._M_use_count;
    local_a8.first = (shared_ptr<trieste::NodeDef> *)&local_50;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_98,(iterator)0x0,&local_a8);
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iStack_90._M_current) {
      local_60 = &(this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_78 = sVar14;
      local_70 = this;
      do {
        node = (Node *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(iStack_90._M_current + -1))
                       ->_vptr__Sp_counted_base;
        p_Var5 = *(__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> **)
                  &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(iStack_90._M_current + -1))->
                   _M_use_count;
        peVar6 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (p_Var5 == (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
                      (peVar6->children).
                      super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          local_38 = *(long *)((long)(local_70->rule_map).map._M_elems +
                              (ulong)(((peVar6->type_).def)->default_map_id & 0xfffffff8));
          if (*(char *)(local_38 + 0x418) == '\0') {
            local_a8.first =
                 (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                 ->children).
                 super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            if ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)local_a8.first ==
                (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
                (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                children).
                super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_68 = 0;
              lVar16 = local_68;
            }
            else {
              local_68 = 0;
              do {
                local_58._M_current = local_a8.first;
                plVar9 = *(long **)(local_38 + 0x18 +
                                   (ulong)(*(uint *)(*(long *)(*(long *)&(local_a8.first)->
                                                                                                                                                  
                                                  super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                                  + 0x10) + 0xc) & 0xfffffff8));
                pEVar19 = (Effect<Node> *)*plVar9;
                pEVar10 = (Effect<Node> *)plVar9[1];
                if (pEVar19 == pEVar10) {
                  pVar20 = -1;
                }
                else {
                  pEVar19 = pEVar19 + 4;
                  pVar20 = -1;
                  do {
                    match->index = 0;
                    ((match->captures).
                     super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first = false;
                    plVar9 = *(long **)&pEVar19[-4].super__Function_base._M_functor;
                    cVar13 = (**(code **)(*plVar9 + 0x20))(plVar9,&local_a8,node,match);
                    if (cVar13 == '\0') {
LAB_00177cd1:
                      local_a8.first = local_58._M_current;
                      bVar11 = false;
                    }
                    else {
                      local_40 = (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
                                 local_a8.first;
                      _Var15 = std::
                               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__ops::_Iter_pred<trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>>
                                         (local_58._M_current);
                      if ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
                          _Var15._M_current != local_40) goto LAB_00177cd1;
                      pVar20 = replace(local_70,match,pEVar19,&local_58,(NodeIt *)&local_a8,node);
                      if (pVar20 == -1) {
                        pVar20 = -1;
                        goto LAB_00177cd1;
                      }
                      local_68 = local_68 + pVar20;
                      bVar11 = true;
                    }
                  } while ((!bVar11) &&
                          (pEVar1 = pEVar19 + 1, pEVar19 = pEVar19 + 5, pEVar1 != pEVar10));
                }
                if (pVar20 == -1) {
                  local_a8.first = (shared_ptr<trieste::NodeDef> *)((long)local_a8.first + 0x10);
                }
                else if ((local_70->direction_ & 4) == 0) {
                  local_a8.first =
                       (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->children).
                       super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                }
                else {
                  local_a8.first =
                       (shared_ptr<trieste::NodeDef> *)((long)local_a8.first + pVar20 * 0x10);
                }
                lVar16 = local_68;
              } while ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)local_a8.first
                       != (__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)
                          (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr)->children).
                          super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          else {
            lVar16 = 0;
          }
          sVar14 = lVar16 + local_78;
          iStack_90._M_current = iStack_90._M_current + -1;
        }
        else {
          *(__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> **)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(iStack_90._M_current + -1))->
            _M_use_count = p_Var5 + 0x10;
          p_Var7 = *(__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> **)p_Var5;
          uVar8 = *(ulong *)(p_Var7 + 0x10);
          uVar3 = *(uint *)(uVar8 + 8);
          sVar14 = local_78;
          if ((uVar3 & 0x40) == 0) {
            p_Var18 = local_60;
            for (p_Var17 = (local_70->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var17 != (_Base_ptr)0x0;
                p_Var17 = (&p_Var17->_M_left)[*(ulong *)(p_Var17 + 1) < uVar8]) {
              if (*(ulong *)(p_Var17 + 1) >= uVar8) {
                p_Var18 = p_Var17;
              }
            }
            p_Var17 = local_60;
            if ((p_Var18 != local_60) && (p_Var17 = p_Var18, uVar8 < *(ulong *)(p_Var18 + 1))) {
              p_Var17 = local_60;
            }
            if (p_Var17 != local_60) {
              local_a8.second._M_current = *(shared_ptr<trieste::NodeDef> **)(p_Var5 + 8);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_a8.second._M_current)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_a8.second._M_current)->_M_use_count + 1;
                }
              }
              local_a8.first = (shared_ptr<trieste::NodeDef> *)p_Var7;
              if (p_Var17[1]._M_right == (_Base_ptr)0x0) {
                std::__throw_bad_function_call();
              }
              lVar16 = (**(code **)(p_Var17 + 2))(&p_Var17[1]._M_parent,&local_a8);
              sVar14 = lVar16 + local_78;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.second._M_current !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a8.second._M_current);
              }
            }
          }
          if ((uVar3 & 0x40) == 0) {
            local_a8.second._M_current = *(shared_ptr<trieste::NodeDef> **)(*(long *)p_Var5 + 0x58);
            local_a8.first = (shared_ptr<trieste::NodeDef> *)p_Var5;
            if (iStack_90._M_current == local_88) {
              std::
              vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
              ::
              _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                        ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                          *)&local_98,iStack_90,&local_a8);
            }
            else {
              (iStack_90._M_current)->first = (shared_ptr<trieste::NodeDef> *)p_Var5;
              ((iStack_90._M_current)->second)._M_current = local_a8.second._M_current;
              iStack_90._M_current = iStack_90._M_current + 1;
            }
          }
        }
        local_78 = sVar14;
      } while (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iStack_90._M_current);
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete(local_98,(long)local_88 - (long)local_98);
    }
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return sVar14;
}

Assistant:

size_t apply_special(Node root, Match& match)
    {
      size_t changes = 0;

      auto add = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        // Don't examine Error or Lift nodes.
        if (node->type() & flag::internal)
          return false;

        if constexpr (Pre)
        {
          auto pre_f = pre_.find(node->type());
          if (pre_f != pre_.end())
            changes += pre_f->second(node);
        }
        if constexpr (Topdown)
          changes += match_children(node, match);

        return true;
      };

      auto remove = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        if constexpr (!Topdown)
          changes += match_children(node, match);
        else
          snmalloc::UNUSED(node);
        if constexpr (Post)
        {
          auto post_f = post_.find(node->type());
          if (post_f != post_.end())
            changes += post_f->second(node);
        }
      };

      root->traverse(add, remove);

      return changes;
    }